

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * ImageFromImage(Image *__return_storage_ptr__,Image image,Rectangle rec)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  void *__src;
  int iVar5;
  float fVar6;
  float fVar7;
  float local_78;
  float local_48;
  float fStack_44;
  
  fVar7 = rec.height;
  iVar5 = 1;
  iVar1 = GetPixelDataSize(1,1,image.format);
  local_78 = rec.width;
  __return_storage_ptr__->width = (int)local_78;
  __return_storage_ptr__->height = (int)fVar7;
  pvVar2 = calloc((long)((int)(local_78 * fVar7) * iVar1),1);
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->format = image.format;
  __return_storage_ptr__->mipmaps = 1;
  if (0.0 < fVar7) {
    iVar3 = (int)local_78 * iVar1;
    local_48 = rec.x;
    fStack_44 = rec.y;
    __src = (void *)(((long)(int)fStack_44 * (long)image.width + (long)(int)local_48) * (long)iVar1
                    + (long)image.data);
    iVar4 = 0;
    do {
      memcpy((void *)((long)pvVar2 + (long)iVar4),__src,(long)iVar3);
      fVar6 = (float)iVar5;
      __src = (void *)((long)__src + (long)iVar1 * (long)image.width);
      iVar4 = iVar4 + iVar3;
      iVar5 = iVar5 + 1;
    } while (fVar6 < fVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Image ImageFromImage(Image image, Rectangle rec)
{
    Image result = { 0 };

    int bytesPerPixel = GetPixelDataSize(1, 1, image.format);

    // TODO: Check rec is valid?

    result.width = (int)rec.width;
    result.height = (int)rec.height;
    result.data = RL_CALLOC((int)(rec.width*rec.height)*bytesPerPixel, 1);
    result.format = image.format;
    result.mipmaps = 1;

    for (int y = 0; y < rec.height; y++)
    {
        memcpy(((unsigned char *)result.data) + y*(int)rec.width*bytesPerPixel, ((unsigned char *)image.data) + ((y + (int)rec.y)*image.width + (int)rec.x)*bytesPerPixel, (int)rec.width*bytesPerPixel);
    }

    return result;
}